

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

void __thiscall
program_options::error_with_option_name::set_option_name
          (error_with_option_name *this,string *option_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *value;
  string *in_stack_ffffffffffffffb8;
  error_with_option_name *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [16];
  undefined8 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  value = (string *)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,(allocator<char> *)in_stack_ffffffffffffffe0);
  set_substitute(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,value);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

virtual void set_option_name(const std::string& option_name)
    {           set_substitute("option", option_name);}